

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O0

void __thiscall
iutest::detail::FieldMatcher<int_(anonymous_namespace)::X::*,_iutest::detail::GeMatcher<int>_>::
~FieldMatcher(FieldMatcher<int_(anonymous_namespace)::X::*,_iutest::detail::GeMatcher<int>_> *this)

{
  FieldMatcher<int_(anonymous_namespace)::X::*,_iutest::detail::GeMatcher<int>_> *this_local;
  
  ~FieldMatcher(this);
  operator_delete(this,0x20);
  return;
}

Assistant:

class FieldMatcher IUTEST_CXX_FINAL : public IMatcher
{
public:
    FieldMatcher(const F& field, const T& expected) : m_field(field), m_expected(expected) {}

public:
    template<typename U>
    AssertionResult operator ()(const U& actual)
    {
        if IUTEST_COND_LIKELY( Check(actual) )
        {
            return AssertionSuccess();
        }
        return AssertionFailure() << WhichIs();
    }

public:
    ::std::string WhichIs() const IUTEST_CXX_OVERRIDE
    {
        iu_global_format_stringstream strm;
        strm << "Field: " << m_expected;
        //strm << "Field: (" << detail::GetTypeNameProxy<F>::GetTypeName() << ") " << m_expected;
        return strm.str();
    }